

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O1

QAbstractItemModel * __thiscall
tst_SerialiserCommon::createStringModel(tst_SerialiserCommon *this,QObject *parent)

{
  result_type_conflict rVar1;
  QStringListModel *this_00;
  int iVar2;
  QString t;
  QStringList itmesList;
  uniform_int_distribution<int> itemsDist;
  uniform_int_distribution<int> rowsDist;
  QString local_90;
  QArrayDataPointer<QString> local_78;
  QObject *local_60;
  param_type local_58;
  QArrayData *local_50 [3];
  param_type local_38;
  
  local_38._M_a = 0x14;
  local_38._M_b = 0x32;
  local_58._M_a = 0;
  local_58._M_b = 1000;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  local_60 = parent;
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_38,&this->generator,&local_38);
  if (0 < rVar1) {
    iVar2 = rVar1 + 1;
    do {
      rVar1 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_58,&this->generator,&local_58);
      QString::number((int)local_50,rVar1);
      local_90.d.d = (Data *)0x0;
      local_90.d.ptr = L"Item ";
      local_90.d.size = 5;
      QString::append(&local_90);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_90);
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,8);
        }
      }
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  this_00 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_00,(QList *)&local_78,local_60);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  return (QAbstractItemModel *)this_00;
}

Assistant:

QAbstractItemModel *tst_SerialiserCommon::createStringModel(QObject *parent)
{
    std::uniform_int_distribution<int> rowsDist(20, 50);
    std::uniform_int_distribution<int> itemsDist(0, 1000);

    QStringList itmesList;
    for (int i = rowsDist(generator); i > 0; --i)
        itmesList.append(QStringLiteral("Item ") + QString::number(itemsDist(generator)));
    return new QStringListModel(itmesList, parent);
}